

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_25(QPDF *pdf,char *arg2)

{
  char cVar1;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle QVar3;
  allocator<char> local_91;
  string local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  QPDF oldpdf;
  allocator<char> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60 [3];
  string local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  QPDFObjectHandle qtest;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (arg2 == (char *)0x0) {
    __assert_fail("arg2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x3bc,"void test_25(QPDF &, const char *)");
  }
  QPDF::QPDF(&oldpdf);
  QPDF::processFile((char *)&oldpdf,arg2);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest",local_78);
  QPDFObjectHandle::getKey((string *)&qtest);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest",&local_91);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qtest);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  QPDF::copyForeignObject(QVar2);
  QPDFObjectHandle::replaceKey(local_90,(QPDFObjectHandle *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Pages",&local_91);
  QPDFObjectHandle::getKey(local_48);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90;
  QPDF::copyForeignObject(QVar3);
  cVar1 = QPDFObjectHandle::isNull();
  if (cVar1 != '\0') {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&qtest.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDF::~QPDF(&oldpdf);
    QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_60);
    return;
  }
  __assert_fail("pdf.copyForeignObject(oldpdf.getRoot().getKey(\"/Pages\")).isNull()",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x3c4,"void test_25(QPDF &, const char *)");
}

Assistant:

static void
test_25(QPDF& pdf, char const* arg2)
{
    // The copy object tests are designed to work with a specific
    // file.  Look at the test suite for the file, and look at the
    // file for comments about the file's structure.

    // Copy qtest without crossing page boundaries.  Should get O1
    // and O2 and their streams but not O3 or any other pages.

    // Also verify that attempts to copy /Pages objects return null.

    assert(arg2 != nullptr);
    {
        // Make sure original PDF is out of scope when we write.
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        pdf.getTrailer().replaceKey("/QTest", pdf.copyForeignObject(qtest));

        assert(pdf.copyForeignObject(oldpdf.getRoot().getKey("/Pages")).isNull());
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}